

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O2

CURLcode curl_easy_pause(Curl_easy *data,int action)

{
  undefined8 *puVar1;
  uint uVar2;
  int type;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  CURLcode CVar6;
  CURLMcode CVar7;
  ulong uVar8;
  char *ptr;
  size_t len;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  dynbuf *s;
  uint uVar12;
  long lVar13;
  undefined8 auStack_d58 [403];
  undefined8 uStack_c0;
  uint local_ac;
  tempbuf writebuf [3];
  
  CVar6 = CURLE_BAD_FUNCTION_ARGUMENT;
  if (((data != (Curl_easy *)0x0) && (data->magic == 0xc0dedbad)) &&
     (data->conn != (connectdata *)0x0)) {
    uVar2 = (data->req).keepon;
    uVar12 = ((action & 1U) << 4 | uVar2 & 0xffffffcf) + (action & 4U) * 8;
    uVar9 = uVar12 & 0x30;
    CVar6 = CURLE_OK;
    if (uVar9 != (uVar2 & 0x30)) {
      if ((((uVar2 & ~uVar12 & 0x20) != 0) &&
          ((data->mstate & ~MSTATE_PENDING) == MSTATE_PERFORMING)) &&
         ((data->state).fread_func == Curl_mime_read)) {
        uStack_c0 = 0x48e2c1;
        Curl_mime_unpause((curl_mimepart *)(data->state).in);
      }
      (data->req).keepon = uVar12;
      if ((action & 1U) == 0) {
        uStack_c0 = 0x48e2db;
        Curl_http2_stream_pause(data,false);
        uVar11 = (ulong)(data->state).tempcount;
        if (uVar11 != 0) {
          lVar13 = 0xcb0;
          uVar8 = uVar11;
          local_ac = uVar9;
          for (uVar10 = 0; uVar10 < uVar8; uVar10 = uVar10 + 1) {
            *(undefined8 *)((long)auStack_d58 + lVar13 + 0x20) =
                 *(undefined8 *)((long)data->sockets + lVar13 + -0x68);
            puVar1 = (undefined8 *)((long)&data->magic + lVar13);
            uVar3 = *puVar1;
            uVar4 = puVar1[1];
            puVar1 = (undefined8 *)((long)data->sockets + lVar13 + -0x78);
            uVar5 = puVar1[1];
            *(undefined8 *)((long)auStack_d58 + lVar13 + 0x10) = *puVar1;
            *(undefined8 *)((long)auStack_d58 + lVar13 + 0x18) = uVar5;
            *(undefined8 *)((long)auStack_d58 + lVar13) = uVar3;
            *(undefined8 *)((long)auStack_d58 + lVar13 + 8) = uVar4;
            uStack_c0 = 0x48e33b;
            Curl_dyn_init((dynbuf *)((long)&data->magic + lVar13),0x4000000);
            uVar8 = (ulong)(data->state).tempcount;
            lVar13 = lVar13 + 0x28;
          }
          (data->state).tempcount = 0;
          CVar6 = CURLE_OK;
          for (lVar13 = 0; uVar11 * 0x28 - lVar13 != 0; lVar13 = lVar13 + 0x28) {
            s = (dynbuf *)((long)&writebuf[0].b.bufr + lVar13);
            if (CVar6 == CURLE_OK) {
              type = *(int *)((long)&writebuf[0].type + lVar13);
              uStack_c0 = 0x48e378;
              ptr = Curl_dyn_ptr(s);
              uStack_c0 = 0x48e383;
              len = Curl_dyn_len(s);
              uStack_c0 = 0x48e393;
              CVar6 = Curl_client_write(data,type,ptr,len);
            }
            uStack_c0 = 0x48e39d;
            Curl_dyn_free(s);
          }
          uVar9 = local_ac;
          if (CVar6 != CURLE_OK) {
            return CVar6;
          }
        }
      }
      if (uVar9 != 0x30) {
        uStack_c0 = 0x48e3bf;
        Curl_expire(data,0,EXPIRE_RUN_NOW);
        (data->state).keeps_speed.tv_sec = 0;
        if ((data->state).tempcount == 0) {
          data->conn->cselect_bits = 3;
        }
        if (data->multi != (Curl_multi *)0x0) {
          uStack_c0 = 0x48e3ef;
          CVar7 = Curl_update_timer(data->multi);
          if (CVar7 != CURLM_OK) {
            return CURLE_ABORTED_BY_CALLBACK;
          }
        }
      }
      CVar6 = CURLE_OK;
      if (((data->state).field_0x6d1 & 8) == 0) {
        uStack_c0 = 0x48e40e;
        CVar6 = Curl_updatesocket(data);
      }
    }
  }
  return CVar6;
}

Assistant:

CURLcode curl_easy_pause(struct Curl_easy *data, int action)
{
  struct SingleRequest *k;
  CURLcode result = CURLE_OK;
  int oldstate;
  int newstate;

  if(!GOOD_EASY_HANDLE(data) || !data->conn)
    /* crazy input, don't continue */
    return CURLE_BAD_FUNCTION_ARGUMENT;

  k = &data->req;
  oldstate = k->keepon & (KEEP_RECV_PAUSE| KEEP_SEND_PAUSE);

  /* first switch off both pause bits then set the new pause bits */
  newstate = (k->keepon &~ (KEEP_RECV_PAUSE| KEEP_SEND_PAUSE)) |
    ((action & CURLPAUSE_RECV)?KEEP_RECV_PAUSE:0) |
    ((action & CURLPAUSE_SEND)?KEEP_SEND_PAUSE:0);

  if((newstate & (KEEP_RECV_PAUSE| KEEP_SEND_PAUSE)) == oldstate) {
    /* Not changing any pause state, return */
    DEBUGF(infof(data, "pause: no change, early return"));
    return CURLE_OK;
  }

  /* Unpause parts in active mime tree. */
  if((k->keepon & ~newstate & KEEP_SEND_PAUSE) &&
     (data->mstate == MSTATE_PERFORMING ||
      data->mstate == MSTATE_RATELIMITING) &&
     data->state.fread_func == (curl_read_callback) Curl_mime_read) {
    Curl_mime_unpause(data->state.in);
  }

  /* put it back in the keepon */
  k->keepon = newstate;

  if(!(newstate & KEEP_RECV_PAUSE)) {
    Curl_http2_stream_pause(data, FALSE);

    if(data->state.tempcount) {
      /* there are buffers for sending that can be delivered as the receive
         pausing is lifted! */
      unsigned int i;
      unsigned int count = data->state.tempcount;
      struct tempbuf writebuf[3]; /* there can only be three */

      /* copy the structs to allow for immediate re-pausing */
      for(i = 0; i < data->state.tempcount; i++) {
        writebuf[i] = data->state.tempwrite[i];
        Curl_dyn_init(&data->state.tempwrite[i].b, DYN_PAUSE_BUFFER);
      }
      data->state.tempcount = 0;

      for(i = 0; i < count; i++) {
        /* even if one function returns error, this loops through and frees
           all buffers */
        if(!result)
          result = Curl_client_write(data, writebuf[i].type,
                                     Curl_dyn_ptr(&writebuf[i].b),
                                     Curl_dyn_len(&writebuf[i].b));
        Curl_dyn_free(&writebuf[i].b);
      }

      if(result)
        return result;
    }
  }

#ifdef USE_HYPER
  if(!(newstate & KEEP_SEND_PAUSE)) {
    /* need to wake the send body waker */
    if(data->hyp.send_body_waker) {
      hyper_waker_wake(data->hyp.send_body_waker);
      data->hyp.send_body_waker = NULL;
    }
  }
#endif

  /* if there's no error and we're not pausing both directions, we want
     to have this handle checked soon */
  if((newstate & (KEEP_RECV_PAUSE|KEEP_SEND_PAUSE)) !=
     (KEEP_RECV_PAUSE|KEEP_SEND_PAUSE)) {
    Curl_expire(data, 0, EXPIRE_RUN_NOW); /* get this handle going again */

    /* reset the too-slow time keeper */
    data->state.keeps_speed.tv_sec = 0;

    if(!data->state.tempcount)
      /* if not pausing again, force a recv/send check of this connection as
         the data might've been read off the socket already */
      data->conn->cselect_bits = CURL_CSELECT_IN | CURL_CSELECT_OUT;
    if(data->multi) {
      if(Curl_update_timer(data->multi))
        return CURLE_ABORTED_BY_CALLBACK;
    }
  }

  if(!data->state.done)
    /* This transfer may have been moved in or out of the bundle, update the
       corresponding socket callback, if used */
    result = Curl_updatesocket(data);

  return result;
}